

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParser.cpp
# Opt level: O1

PDFObject * __thiscall PDFObjectParser::ParseLiteralString(PDFObjectParser *this,string *inToken)

{
  pointer pcVar1;
  ulong uVar2;
  byte bVar3;
  pointer pcVar4;
  Trace *this_00;
  PDFLiteralString *this_01;
  undefined8 uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  code *pcVar9;
  stringbuf stringBuffer;
  char local_e9;
  string local_e8;
  PDFObjectParser *local_c8;
  code *local_c0;
  string local_b8;
  code *local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  locale local_60 [8];
  undefined4 local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  pcVar9 = __assert_fail;
  local_98 = __assert_fail;
  local_90 = 0;
  uStack_88 = 0;
  local_80 = 0;
  uStack_78 = 0;
  local_70 = 0;
  uStack_68 = 0;
  std::locale::locale(local_60);
  local_98 = std::ios_base::Init::~Init;
  local_58 = 0x18;
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  if (inToken->_M_string_length == 0) {
    uVar5 = std::__throw_out_of_range_fmt
                      ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    operator_delete(inToken,0x68);
    std::__cxx11::stringbuf::~stringbuf((stringbuf *)&local_98);
    _Unwind_Resume(uVar5);
  }
  pcVar4 = (inToken->_M_dataplus)._M_p;
  if (pcVar4[inToken->_M_string_length - 1] == ')') {
    local_c0 = __assert_fail;
    uVar7 = inToken->_M_string_length;
    local_c8 = this;
    if (uVar7 - 3 < 0xfffffffffffffffe) {
      uVar6 = 1;
      do {
        local_e9 = pcVar4[1];
        if (local_e9 == '\\') {
          pcVar1 = pcVar4 + 2;
          uVar8 = uVar6 + 1;
          bVar3 = pcVar4[2];
          if ((bVar3 & 0xf8) == 0x30) {
            local_e9 = bVar3 - 0x30;
            uVar2 = uVar6 + 2;
            if ((uVar2 < uVar7) && ((pcVar4[3] & 0xf8U) == 0x30)) {
              local_e9 = pcVar4[3] + local_e9 * '\b' + -0x30;
              uVar8 = uVar2;
              pcVar1 = pcVar4 + 3;
              if ((uVar6 + 3 < uVar7) && ((pcVar4[4] & 0xf8U) == 0x30)) {
                local_e9 = pcVar4[4] + local_e9 * '\b' + -0x30;
                uVar8 = uVar6 + 3;
                pcVar1 = pcVar4 + 4;
              }
            }
          }
          else if (bVar3 < 0x66) {
            if (bVar3 < 0x5c) {
              if (bVar3 == 0x28) {
                local_e9 = '(';
              }
              else if (bVar3 == 0x29) {
                local_e9 = ')';
              }
              else {
LAB_001d44b6:
                local_e9 = '\0';
              }
            }
            else if (bVar3 == 0x5c) {
              local_e9 = '\\';
            }
            else {
              if (bVar3 != 0x62) goto LAB_001d44b6;
              local_e9 = '\b';
            }
          }
          else if (bVar3 < 0x72) {
            if (bVar3 == 0x66) {
              local_e9 = '\f';
            }
            else {
              if (bVar3 != 0x6e) goto LAB_001d44b6;
              local_e9 = '\n';
            }
          }
          else if (bVar3 == 0x72) {
            local_e9 = '\r';
          }
          else {
            if (bVar3 != 0x74) goto LAB_001d44b6;
            local_e9 = '\t';
          }
        }
        else {
          uVar8 = uVar6;
          pcVar1 = pcVar4 + 1;
        }
        pcVar4 = pcVar1;
        (**(code **)(local_98 + 0x60))(&local_98,&local_e9,1);
        uVar6 = uVar8 + 1;
        uVar7 = inToken->_M_string_length;
      } while (uVar6 < uVar7 - 1);
    }
    this_01 = (PDFLiteralString *)operator_new(0x68);
    pcVar9 = local_c0;
    std::__cxx11::stringbuf::str();
    MaybeDecryptString(&local_e8,local_c8,&local_b8);
    PDFLiteralString::PDFLiteralString(this_01,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    this_00 = Trace::DefaultTrace();
    std::__cxx11::string::substr((ulong)&local_e8,(ulong)inToken);
    Trace::TraceToLog(this_00,
                      "PDFObjectParser::ParseLiteralString, exception in parsing literal string, no closing paranthesis, Expression: %s"
                      ,local_e8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    this_01 = (PDFLiteralString *)0x0;
  }
  local_98 = std::ios_base::Init::~Init;
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  local_98 = pcVar9;
  std::locale::~locale(local_60);
  return &this_01->super_PDFObject;
}

Assistant:

PDFObject* PDFObjectParser::ParseLiteralString(const std::string& inToken)
{
  std::stringbuf stringBuffer;
	Byte buffer;
	std::string::const_iterator it = inToken.begin();
	size_t i=1;
	++it; // skip first paranthesis
	
	// verify that last character is ')'
	if(inToken.at(inToken.size()-1) != scRightParanthesis)
	{
		TRACE_LOG1("PDFObjectParser::ParseLiteralString, exception in parsing literal string, no closing paranthesis, Expression: %s",inToken.substr(0, MAX_TRACE_SIZE - 200).c_str());
		return NULL;
	}

	for(; i < inToken.size()-1;++it,++i)
	{
		if(*it == '\\')
		{
			++it;
			++i;
			if('0' <= *it && *it <= '7')
			{
				buffer = (*it - '0');
				if (i+1 < inToken.size() && '0' <= *(it+1) && *(it+1) <= '7'){
					++it;
					++i;
					buffer = buffer << 3;
					buffer += (*it - '0');
					if (i + 1 < inToken.size() && '0' <= *(it + 1) && *(it + 1) <= '7'){
						++it;
						++i;
						buffer = buffer << 3;
						buffer += (*it - '0');
					}
				}
			}
			else
			{
				switch(*it)
				{
					case 'n':
						buffer = '\n';
						break;
					case 'r':
						buffer = '\r';
						break;
					case 't':
						buffer = '\t';
						break;
					case 'b':
						buffer = '\b';
						break;
					case 'f':
						buffer = '\f';
						break;
					case '\\':
						buffer = '\\';
						break;
					case '(':
						buffer = '(';
						break;
					case ')':
						buffer = ')';
						break;
					default:
						// error!
						buffer = 0;
						break;
				}
			}
		}
		else
		{
			buffer = *it;
		}
		stringBuffer.sputn((const char*)&buffer,1);
	}

	return new PDFLiteralString(MaybeDecryptString(stringBuffer.str()));
}